

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O2

char * parse_ld_trace_line_path(char *line)

{
  char *pcVar1;
  ushort **ppuVar2;
  
  pcVar1 = strstr(line,"=> ");
  if (pcVar1 == (char *)0x0) {
    for (; line != (char *)0x0; line = line + 1) {
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)*line * 2 + 1) & 0x20) == 0) goto LAB_001040f3;
    }
    line = (char *)0x0;
  }
  else {
    line = pcVar1 + 3;
  }
LAB_001040f3:
  pcVar1 = strstr(line," (");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strndup(line,(long)pcVar1 - (long)line);
    return pcVar1;
  }
  pcVar1 = strdup(line);
  return pcVar1;
}

Assistant:

char *parse_ld_trace_line_path(const char *line) {
    char *path = NULL;
    const char *path_start = strstr(line, "=> ");
    if (path_start != NULL) {
        path_start += 3;
    } else {
        path_start = line;
        while (path_start != NULL && isspace(*path_start))
            path_start++;
    }

    char *path_end = strstr(path_start, " (");

    if (path_end != NULL)
        path = strndup(path_start, path_end - path_start);
    else
        path = strdup(path_start);


    return path;
}